

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Module.cpp
# Opt level: O0

void __thiscall Module::Module(Module *this,QObject *parent)

{
  QUndoGroup *this_00;
  Object local_30 [24];
  QObject *local_18;
  QObject *parent_local;
  Module *this_local;
  
  local_18 = parent;
  parent_local = &this->super_QObject;
  QObject::QObject(&this->super_QObject,parent);
  *(undefined ***)this = &PTR_metaObject_002d4208;
  trackerboy::Module::Module(&this->mModule);
  (this->mMutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
  QMutex::QMutex(&this->mMutex);
  this_00 = (QUndoGroup *)operator_new(0x10);
  QUndoGroup::QUndoGroup(this_00,&this->super_QObject);
  this->mUndoGroup = this_00;
  *(undefined8 *)&(this->mUndoStacks)._M_h._M_rehash_policy = 0;
  (this->mUndoStacks)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->mUndoStacks)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->mUndoStacks)._M_h._M_element_count = 0;
  (this->mUndoStacks)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->mUndoStacks)._M_h._M_bucket_count = 0;
  (this->mUndoStacks)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  unordered_map<trackerboy::Song_*,_std::unique_ptr<QUndoStack,_std::default_delete<QUndoStack>_>,_std::hash<trackerboy::Song_*>,_std::equal_to<trackerboy::Song_*>,_std::allocator<std::pair<trackerboy::Song_*const,_std::unique_ptr<QUndoStack,_std::default_delete<QUndoStack>_>_>_>_>
  ::unordered_map(&this->mUndoStacks);
  std::shared_ptr<trackerboy::Song>::shared_ptr(&this->mSong);
  this->mPermaDirty = false;
  this->mModified = false;
  nameFirstSong(this);
  reset(this);
  QObject::connect<void(QUndoGroup::*)(bool),Module::Module(QObject*)::__0>
            (local_30,(offset_in_QUndoGroup_to_subr)this->mUndoGroup,
             (QObject *)QUndoGroup::cleanChanged,(anon_class_8_1_8991fb9c_for_function)0x0,
             (ConnectionType)this);
  QMetaObject::Connection::~Connection((Connection *)local_30);
  return;
}

Assistant:

Module::Module(QObject *parent) :
    QObject(parent),
    mModule(),
    mMutex(),
    mUndoGroup(new QUndoGroup(this)),
    mUndoStacks(),
    mSong(),
    mPermaDirty(false),
    mModified(false)
{
    nameFirstSong();
    reset();

    connect(mUndoGroup, &QUndoGroup::cleanChanged, this,
        [this](bool clean) {
            bool modified = mPermaDirty || !clean;
            if (mModified != modified) {
                mModified = modified;
                emit modifiedChanged(mModified);
            }
        });
}